

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftglyph.c
# Opt level: O2

FT_Error FT_Glyph_Copy(FT_Glyph source,FT_Glyph *target)

{
  FT_Glyph_Class *clazz;
  undefined4 uVar1;
  undefined4 uVar2;
  FT_Pos FVar3;
  FT_Error FVar4;
  FT_Glyph copy;
  
  FVar4 = 6;
  if ((source != (FT_Glyph)0x0 && target != (FT_Glyph *)0x0) &&
     (source->clazz != (FT_Glyph_Class *)0x0)) {
    *target = (FT_Glyph)0x0;
    clazz = source->clazz;
    if ((clazz != (FT_Glyph_Class *)0x0) &&
       (FVar4 = ft_new_glyph(source->library,clazz,&copy), FVar4 == 0)) {
      uVar1 = *(undefined4 *)((long)&(source->advance).x + 4);
      FVar3 = (source->advance).y;
      uVar2 = *(undefined4 *)((long)&(source->advance).y + 4);
      *(int *)&(copy->advance).x = (int)(source->advance).x;
      *(undefined4 *)((long)&(copy->advance).x + 4) = uVar1;
      *(int *)&(copy->advance).y = (int)FVar3;
      *(undefined4 *)((long)&(copy->advance).y + 4) = uVar2;
      copy->format = source->format;
      if ((clazz->glyph_copy != (FT_Glyph_CopyFunc)0x0) &&
         (FVar4 = (*clazz->glyph_copy)(source,copy), FVar4 != 0)) {
        FT_Done_Glyph(copy);
        return FVar4;
      }
      *target = copy;
      FVar4 = 0;
    }
  }
  return FVar4;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Glyph_Copy( FT_Glyph   source,
                 FT_Glyph  *target )
  {
    FT_Glyph               copy;
    FT_Error               error;
    const FT_Glyph_Class*  clazz;


    /* check arguments */
    if ( !target || !source || !source->clazz )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    *target = NULL;

    if ( !source || !source->clazz )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    clazz = source->clazz;
    error = ft_new_glyph( source->library, clazz, &copy );
    if ( error )
      goto Exit;

    copy->advance = source->advance;
    copy->format  = source->format;

    if ( clazz->glyph_copy )
      error = clazz->glyph_copy( source, copy );

    if ( error )
      FT_Done_Glyph( copy );
    else
      *target = copy;

  Exit:
    return error;
  }